

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Revision.cpp
# Opt level: O3

string * __thiscall
OpenMD::Revision::getHalfRevision_abi_cxx11_(string *__return_storage_ptr__,Revision *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Revision *pRVar2;
  string local_60;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  getVersion_abi_cxx11_(&local_60,this);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_60);
  paVar1 = &local_60.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  pRVar2 = (Revision *)0x1e4fdb;
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  getRevision_abi_cxx11_(&local_40,pRVar2);
  std::__cxx11::string::substr((ulong)&local_60,(ulong)&local_40);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  pRVar2 = (Revision *)0x1e4fda;
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  getBuildDate_abi_cxx11_(&local_60,pRVar2);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Revision::getHalfRevision() {
    std::string fr;
    fr.assign(getVersion());
    fr.append("  ");
    fr.append(getRevision().substr(0, 17));
    fr.append("   ");
    fr.append(getBuildDate());
    return fr;
  }